

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O2

sptr_t wal_write(sptr_t buf,image_data_conflict image,int wal_type)

{
  long lVar1;
  uchar *puVar2;
  size_t sVar3;
  uchar *puVar4;
  sptr_t sVar5;
  uchar *local_38;
  
  puVar4 = buf.ptr;
  if (wal_type == 1) {
    puVar4[0x10] = '\0';
    puVar4[0x11] = '\0';
    puVar4[0x12] = '\0';
    puVar4[0x13] = '\0';
    puVar4[0x14] = '\0';
    puVar4[0x15] = '\0';
    puVar4[0x16] = '\0';
    puVar4[0x17] = '\0';
    puVar4[0x18] = '\0';
    puVar4[0x19] = '\0';
    puVar4[0x1a] = '\0';
    puVar4[0x1b] = '\0';
    puVar4[0x1c] = '\0';
    puVar4[0x1d] = '\0';
    puVar4[0x1e] = '\0';
    puVar4[0x1f] = '\0';
    puVar4[0] = '\0';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    puVar4[4] = '\0';
    puVar4[5] = '\0';
    puVar4[6] = '\0';
    puVar4[7] = '\0';
    puVar4[8] = '\0';
    puVar4[9] = '\0';
    puVar4[10] = '\0';
    puVar4[0xb] = '\0';
    puVar4[0xc] = '\0';
    puVar4[0xd] = '\0';
    puVar4[0xe] = '\0';
    puVar4[0xf] = '\0';
    local_38 = puVar4 + 0x20;
    write_le32(image.width,&local_38);
    write_le32(image.height,&local_38);
    local_38[0x20] = '\0';
    local_38[0x21] = '\0';
    local_38[0x22] = '\0';
    local_38[0x23] = '\0';
    local_38[0x24] = '\0';
    local_38[0x25] = '\0';
    local_38[0x26] = '\0';
    local_38[0x27] = '\0';
    local_38[0x28] = '\0';
    local_38[0x29] = '\0';
    local_38[0x2a] = '\0';
    local_38[0x2b] = '\0';
    local_38[0x2c] = '\0';
    local_38[0x2d] = '\0';
    local_38[0x2e] = '\0';
    local_38[0x2f] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[0x18] = '\0';
    local_38[0x19] = '\0';
    local_38[0x1a] = '\0';
    local_38[0x1b] = '\0';
    local_38[0x1c] = '\0';
    local_38[0x1d] = '\0';
    local_38[0x1e] = '\0';
    local_38[0x1f] = '\0';
    local_38 = local_38 + 0x30;
    write_le32(0,&local_38);
    write_le32(0,&local_38);
    write_le32(0,&local_38);
    sVar5 = sptr_advance(buf,100);
    wal_write_mips(sVar5,&image,4,(uint32_t *)(puVar4 + 0x28));
    for (lVar1 = 10; puVar2 = puVar4, sVar3 = buf.size, lVar1 != 0xe; lVar1 = lVar1 + 1) {
      *(int *)(puVar4 + lVar1 * 4) = *(int *)(puVar4 + lVar1 * 4) + 100;
    }
  }
  else {
    puVar2 = (uchar *)0x0;
    sVar3 = 0;
    if (wal_type == 2) {
      local_38 = puVar4;
      write_8('\x03',&local_38);
      local_38[0x13] = '\0';
      local_38[0x14] = '\0';
      local_38[0x15] = '\0';
      local_38[0x16] = '\0';
      local_38[0x17] = '\0';
      local_38[0x18] = '\0';
      local_38[0x19] = '\0';
      local_38[0x1a] = '\0';
      local_38[0x1b] = '\0';
      local_38[0x1c] = '\0';
      local_38[0x1d] = '\0';
      local_38[0x1e] = '\0';
      local_38[0x1f] = '\0';
      local_38[0x20] = '\0';
      local_38[0x21] = '\0';
      local_38[0x22] = '\0';
      local_38[3] = '\0';
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      local_38[8] = '\0';
      local_38[9] = '\0';
      local_38[10] = '\0';
      local_38[0xb] = '\0';
      local_38[0xc] = '\0';
      local_38[0xd] = '\0';
      local_38[0xe] = '\0';
      local_38[0xf] = '\0';
      local_38[0x10] = '\0';
      local_38[0x11] = '\0';
      local_38[0x12] = '\0';
      local_38 = local_38 + 0x23;
      write_le32(image.width,&local_38);
      write_le32(image.height,&local_38);
      local_38[0x34] = '\0';
      local_38[0x35] = '\0';
      local_38[0x36] = '\0';
      local_38[0x37] = '\0';
      local_38[0x38] = '\0';
      local_38[0x39] = '\0';
      local_38[0x3a] = '\0';
      local_38[0x3b] = '\0';
      local_38[0x3c] = '\0';
      local_38[0x3d] = '\0';
      local_38[0x3e] = '\0';
      local_38[0x3f] = '\0';
      local_38[0x40] = '\0';
      local_38[0x41] = '\0';
      local_38[0x42] = '\0';
      local_38[0x43] = '\0';
      local_38[0x24] = '\0';
      local_38[0x25] = '\0';
      local_38[0x26] = '\0';
      local_38[0x27] = '\0';
      local_38[0x28] = '\0';
      local_38[0x29] = '\0';
      local_38[0x2a] = '\0';
      local_38[0x2b] = '\0';
      local_38[0x2c] = '\0';
      local_38[0x2d] = '\0';
      local_38[0x2e] = '\0';
      local_38[0x2f] = '\0';
      local_38[0x30] = '\0';
      local_38[0x31] = '\0';
      local_38[0x32] = '\0';
      local_38[0x33] = '\0';
      local_38 = local_38 + 0x44;
      write_le32(0,&local_38);
      write_le32(0,&local_38);
      puVar2 = local_38;
      memcpy(local_38,image.palette.data.ptr,0x300);
      local_38 = puVar2 + 0x300;
      write_le32(0,&local_38);
      sVar5 = sptr_advance(buf,0x37c);
      wal_write_mips(sVar5,&image,9,(uint32_t *)(puVar4 + 0x2c));
      for (lVar1 = 0xb; puVar2 = puVar4, sVar3 = buf.size, lVar1 != 0x14; lVar1 = lVar1 + 1) {
        *(int *)(puVar4 + lVar1 * 4) = *(int *)(puVar4 + lVar1 * 4) + 0x37c;
      }
    }
  }
  sVar5.size = sVar3;
  sVar5.ptr = puVar2;
  return sVar5;
}

Assistant:

sptr_t wal_write(sptr_t buf, const struct image_data image, int wal_type)
{
	switch (wal_type) {
		case WAL_TYPE_DAIKATANA:
			return wal_write_dk(buf, &image);
		case WAL_TYPE_QUAKE2:
			return wal_write_q2(buf, &image);
		default:
			return SPTR_NULL;
	}
}